

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_Fac_Trace_Test::TestBody(InterpTest_Fac_Trace_Test *this)

{
  initializer_list<wabt::interp::Value> __l;
  bool bVar1;
  DefinedFunc *this_00;
  char *message;
  type buf_00;
  undefined1 local_118 [8];
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> buf;
  Message local_100;
  Enum local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  anon_union_16_6_113bff37_for_Value_0 local_d8;
  anon_union_16_6_113bff37_for_Value_0 *local_c8;
  size_type local_c0;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_b8;
  Result local_9c;
  undefined1 local_98 [4];
  Result result;
  MemoryStream stream;
  Ptr trap;
  Values results;
  Ptr func;
  InterpTest_Fac_Trace_Test *this_local;
  
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (anonymous_namespace)::s_fac_module);
  memset(&func.root_index_,0,0x18);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&func.root_index_);
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)&func.root_index_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector
            ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&func.root_index_);
  InterpTest::GetFuncExport
            ((Ptr *)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_InterpTest,0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)&stream.buf_);
  wabt::MemoryStream::MemoryStream((MemoryStream *)local_98,(Stream *)0x0);
  this_00 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->
                      ((RefPtr<wabt::interp::DefinedFunc> *)
                       &results.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_d8.v128_.v = (v128)wabt::interp::Value::Make(2);
  local_c8 = &local_d8;
  local_c0 = 1;
  std::allocator<wabt::interp::Value>::allocator
            ((allocator<wabt::interp::Value> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  __l._M_len = local_c0;
  __l._M_array = (iterator)local_c8;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            (&local_b8,__l,
             (allocator_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_9c = wabt::interp::Func::Call
                       (&this_00->super_Func,&(this->super_InterpTest).store_,&local_b8,
                        (Values *)&trap.root_index_,(Ptr *)&stream.buf_,(Stream *)local_98);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_b8);
  std::allocator<wabt::interp::Value>::~allocator
            ((allocator<wabt::interp::Value> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_f4 = Ok;
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_f0,"Result::Ok","result",&local_f4,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffef8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-interp.cc"
               ,0xba,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffef8,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef8);
    testing::Message::~Message(&local_100);
  }
  buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._5_3_ = 0;
  buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  if (buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
      super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_4_ == 0) {
    wabt::MemoryStream::ReleaseOutputBuffer((MemoryStream *)local_118);
    buf_00 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
             operator*((unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *)
                       local_118);
    InterpTest::ExpectBufferStrEq
              (&this->super_InterpTest,buf_00,
               "#0.    0: V:1  | alloca 1\n#0.    8: V:2  | i32.const 1\n#0.   16: V:3  | local.set $2, 1\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 2\n#0.   44: V:4  | br_unless @60, 0\n#0.   60: V:3  | local.get $3\n#0.   68: V:4  | i32.mul 1, 2\n#0.   72: V:3  | local.set $2, 2\n#0.   80: V:2  | local.get $2\n#0.   88: V:3  | i32.const 1\n#0.   96: V:4  | i32.sub 2, 1\n#0.  100: V:3  | local.set $3, 1\n#0.  108: V:2  | br @24\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 1\n#0.   44: V:4  | br_unless @60, 0\n#0.   60: V:3  | local.get $3\n#0.   68: V:4  | i32.mul 2, 1\n#0.   72: V:3  | local.set $2, 2\n#0.   80: V:2  | local.get $2\n#0.   88: V:3  | i32.const 1\n#0.   96: V:4  | i32.sub 1, 1\n#0.  100: V:3  | local.set $3, 0\n#0.  108: V:2  | br @24\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 0\n#0.   44: V:4  | br_unless @60, 1\n#0.   52: V:3  | br @116\n#0.  116: V:3  | drop_keep $2 $1\n#0.  128: V:1  | return\n"
              );
    std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::~unique_ptr
              ((unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *)local_118
              );
    buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
    super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_4_ = 0;
  }
  wabt::MemoryStream::~MemoryStream((MemoryStream *)local_98);
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)&stream.buf_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)
             &results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(InterpTest, Fac_Trace) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  MemoryStream stream;
  Result result = func->Call(store_, {Value::Make(2)}, results, &trap, &stream);
  ASSERT_EQ(Result::Ok, result);

  auto buf = stream.ReleaseOutputBuffer();
  ExpectBufferStrEq(*buf,
R"(#0.    0: V:1  | alloca 1
#0.    8: V:2  | i32.const 1
#0.   16: V:3  | local.set $2, 1
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 2
#0.   44: V:4  | br_unless @60, 0
#0.   60: V:3  | local.get $3
#0.   68: V:4  | i32.mul 1, 2
#0.   72: V:3  | local.set $2, 2
#0.   80: V:2  | local.get $2
#0.   88: V:3  | i32.const 1
#0.   96: V:4  | i32.sub 2, 1
#0.  100: V:3  | local.set $3, 1
#0.  108: V:2  | br @24
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 1
#0.   44: V:4  | br_unless @60, 0
#0.   60: V:3  | local.get $3
#0.   68: V:4  | i32.mul 2, 1
#0.   72: V:3  | local.set $2, 2
#0.   80: V:2  | local.get $2
#0.   88: V:3  | i32.const 1
#0.   96: V:4  | i32.sub 1, 1
#0.  100: V:3  | local.set $3, 0
#0.  108: V:2  | br @24
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 0
#0.   44: V:4  | br_unless @60, 1
#0.   52: V:3  | br @116
#0.  116: V:3  | drop_keep $2 $1
#0.  128: V:1  | return
)");
}